

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool anon_unknown.dwarf_41b5d::SetSourcei64v
               (ALsource *Source,ALCcontext *Context,SourceProp prop,
               span<const_long,_18446744073709551615UL> values)

{
  index_type iVar1;
  reference plVar2;
  uint in_EDX;
  ALCcontext *in_RSI;
  bool bVar3;
  SourceProp in_stack_000000ec;
  ALCcontext *in_stack_000000f0;
  ALsource *in_stack_000000f8;
  span<const_float,_18446744073709551615UL> in_stack_00000100;
  int ivals [6];
  float fvals [6];
  SourceProp in_stack_0000046c;
  ALCcontext *in_stack_00000470;
  ALsource *in_stack_00000478;
  span<const_int,_18446744073709551615UL> in_stack_00000480;
  span<const_float,_18446744073709551615UL> local_c8;
  span<const_float,_18446744073709551615UL> local_b8;
  span<const_float,_18446744073709551615UL> local_a8;
  span<const_int,_18446744073709551615UL> local_98;
  span<const_int,_18446744073709551615UL> local_88;
  span<const_int,_18446744073709551615UL> local_78;
  int local_68;
  undefined4 local_64;
  undefined4 local_60;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  uint local_2c;
  ALCcontext *local_28;
  span<const_long,_18446744073709551615UL> local_18;
  
  local_2c = in_EDX;
  local_28 = in_RSI;
  if (in_EDX == 0x202) {
LAB_001652df:
    iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
    bVar3 = true;
    if (iVar1 != 1) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      bVar3 = iVar1 == 6;
    }
    if (!bVar3) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar1);
      return false;
    }
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
    bVar3 = false;
    if (*plVar2 < 0x80000000) {
      plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
      bVar3 = -0x80000001 < *plVar2;
    }
    if (!bVar3) {
      ALCcontext::setError(local_28,0xa003,"Value out of range");
      return false;
    }
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
    local_68 = (int)*plVar2;
    al::span<const_int,_18446744073709551615UL>::span(&local_78,&local_68,1);
    bVar3 = SetSourceiv(in_stack_00000478,in_stack_00000470,in_stack_0000046c,in_stack_00000480);
    return bVar3;
  }
  if (in_EDX - 0x1001 < 3) goto LAB_0016592f;
  if (in_EDX - 0x1004 < 3) {
    iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
    bVar3 = true;
    if (iVar1 != 3) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      bVar3 = iVar1 == 6;
    }
    if (!bVar3) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                 iVar1);
      return false;
    }
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
    local_48 = (float)*plVar2;
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,1);
    local_44 = (float)*plVar2;
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,2);
    local_40 = (float)*plVar2;
    al::span<const_float,_18446744073709551615UL>::span(&local_b8,&local_48,3);
    bVar3 = SetSourcefv(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_00000100);
    return bVar3;
  }
  if (in_EDX == 0x1007) goto LAB_001652df;
  if (in_EDX == 0x1009) {
LAB_001654b3:
    iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
    bVar3 = true;
    if (iVar1 != 1) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      bVar3 = iVar1 == 6;
    }
    if (!bVar3) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar1);
      return false;
    }
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
    bVar3 = false;
    if (*plVar2 < 0x100000000) {
      plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
      bVar3 = -1 < *plVar2;
    }
    if (!bVar3) {
      ALCcontext::setError(local_28,0xa003,"Value out of range");
      return false;
    }
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
    local_68 = (int)*plVar2;
    al::span<const_int,_18446744073709551615UL>::span(&local_88,&local_68,1);
    bVar3 = SetSourceiv(in_stack_00000478,in_stack_00000470,in_stack_0000046c,in_stack_00000480);
    return bVar3;
  }
  if ((in_EDX == 0x100a) || (in_EDX - 0x100d < 2)) {
LAB_0016592f:
    iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
    bVar3 = true;
    if (iVar1 != 1) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      bVar3 = iVar1 == 6;
    }
    if (!bVar3) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar1);
      return false;
    }
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
    local_48 = (float)*plVar2;
    al::span<const_float,_18446744073709551615UL>::span(&local_a8,&local_48,1);
    bVar3 = SetSourcefv(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_00000100);
    return bVar3;
  }
  if (in_EDX == 0x100f) {
    iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
    bVar3 = true;
    if (iVar1 != 6) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      bVar3 = iVar1 == 6;
    }
    if (!bVar3) {
      iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,6,
                 iVar1);
      return false;
    }
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
    local_48 = (float)*plVar2;
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,1);
    local_44 = (float)*plVar2;
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,2);
    local_40 = (float)*plVar2;
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,3);
    local_3c = (float)*plVar2;
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,4);
    local_38 = (float)*plVar2;
    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,5);
    local_34 = (float)*plVar2;
    al::span<const_float,_18446744073709551615UL>::span(&local_c8,&local_48,6);
    bVar3 = SetSourcefv(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_00000100);
    return bVar3;
  }
  if ((in_EDX == 0x1010) || (in_EDX - 0x1015 < 2)) goto LAB_001652ae;
  if (in_EDX - 0x1020 < 4) goto LAB_0016592f;
  if (in_EDX - 0x1024 < 3) goto LAB_001652df;
  if (in_EDX == 0x1027) goto LAB_001652ae;
  if (in_EDX == 0x1030) goto LAB_00165d92;
  if (in_EDX == 0x1031) goto LAB_0016592f;
  if (in_EDX == 0x1033) goto LAB_001652df;
  if (in_EDX == 0x1200) {
LAB_001652ae:
    ALCcontext::setError(in_RSI,0xa004,"Setting read-only source property 0x%04x",(ulong)in_EDX);
  }
  else {
    if (in_EDX != 0x1201) {
      if (in_EDX == 0x1202) goto LAB_001652ae;
      if (in_EDX != 0x1203) {
        if ((in_EDX == 0x1212) || (in_EDX == 0x1214)) goto LAB_001652df;
        if (in_EDX == 0xc000) goto LAB_0016592f;
        if (in_EDX == 0xd000) goto LAB_001652df;
        if (in_EDX == 0x20005) goto LAB_001654b3;
        if (in_EDX == 0x20006) {
          iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
          bVar3 = true;
          if (iVar1 != 3) {
            iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
            bVar3 = iVar1 == 6;
          }
          if (!bVar3) {
            iVar1 = al::span<const_long,_18446744073709551615UL>::size(&local_18);
            ALCcontext::setError
                      (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_2c,3,iVar1);
            return false;
          }
          plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
          bVar3 = false;
          if (*plVar2 < 0x100000000) {
            plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
            bVar3 = false;
            if (-1 < *plVar2) {
              plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,1);
              bVar3 = false;
              if (*plVar2 < 0x100000000) {
                plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,1);
                bVar3 = false;
                if (-1 < *plVar2) {
                  plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,2);
                  bVar3 = false;
                  if (*plVar2 < 0x100000000) {
                    plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,2);
                    bVar3 = -1 < *plVar2;
                  }
                }
              }
            }
          }
          if (!bVar3) {
            ALCcontext::setError(local_28,0xa003,"Value out of range");
            return false;
          }
          plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,0);
          local_68 = (int)*plVar2;
          plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,1);
          local_64 = (undefined4)*plVar2;
          plVar2 = al::span<const_long,_18446744073709551615UL>::operator[](&local_18,2);
          local_60 = (undefined4)*plVar2;
          al::span<const_int,_18446744073709551615UL>::span(&local_98,&local_68,3);
          bVar3 = SetSourceiv(in_stack_00000478,in_stack_00000470,in_stack_0000046c,
                              in_stack_00000480);
          return bVar3;
        }
        if (in_EDX - 0x20007 < 3) goto LAB_0016592f;
        if (in_EDX - 0x2000a < 3) goto LAB_001652df;
      }
    }
LAB_00165d92:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",(ulong)in_EDX);
    }
    ALCcontext::setError(local_28,0xa002,"Invalid source integer64 property 0x%04x",(ulong)local_2c)
    ;
  }
  return false;
}

Assistant:

bool SetSourcei64v(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const int64_t> values)
{
    float fvals[MaxValues];
    int   ivals[MaxValues];

    switch(prop)
    {
    case AL_SOURCE_TYPE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
    case AL_SOURCE_STATE:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    /* 1x int */
    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_DISTANCE_MODEL:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] <= INT_MAX && values[0] >= INT_MIN);

        ivals[0] = static_cast<int>(values[0]);
        return SetSourceiv(Source, Context, prop, {ivals, 1u});

    /* 1x uint */
    case AL_BUFFER:
    case AL_DIRECT_FILTER:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] <= UINT_MAX && values[0] >= 0);

        ivals[0] = static_cast<int>(values[0]);
        return SetSourceiv(Source, Context, prop, {ivals, 1u});

    /* 3x uint */
    case AL_AUXILIARY_SEND_FILTER:
        CHECKSIZE(values, 3);
        CHECKVAL(values[0] <= UINT_MAX && values[0] >= 0 && values[1] <= UINT_MAX && values[1] >= 0
            && values[2] <= UINT_MAX && values[2] >= 0);

        ivals[0] = static_cast<int>(values[0]);
        ivals[1] = static_cast<int>(values[1]);
        ivals[2] = static_cast<int>(values[2]);
        return SetSourceiv(Source, Context, prop, {ivals, 3u});

    /* 1x float */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_DOPPLER_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        fvals[0] = static_cast<float>(values[0]);
        return SetSourcefv(Source, Context, prop, {fvals, 1u});

    /* 3x float */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        return SetSourcefv(Source, Context, prop, {fvals, 3u});

    /* 6x float */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        fvals[3] = static_cast<float>(values[3]);
        fvals[4] = static_cast<float>(values[4]);
        fvals[5] = static_cast<float>(values[5]);
        return SetSourcefv(Source, Context, prop, {fvals, 6u});

    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
    case AL_STEREO_ANGLES:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer64 property 0x%04x", prop);
    return false;
}